

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  BoxPoint *__args;
  long lVar3;
  void *pvVar4;
  char cVar5;
  int iVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined8 *in_R8;
  pointer pBVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  vector<BoxPoint,_std::allocator<BoxPoint>_> predictedTrajectory;
  vector<BoxPoint,_std::allocator<BoxPoint>_> centers;
  vector<BoxPoint,_std::allocator<BoxPoint>_> initialTrajectory;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  Rect rect;
  string videoFile;
  VideoCapture vid;
  Mat frame;
  Mat lastFrame;
  Mat firstFrame;
  Mat thresh;
  Mat frameDelta;
  Mat grayFrame;
  _InputArray *in_stack_fffffffffffffb68;
  _InputArray local_488;
  undefined8 uStack_470;
  _InputArray local_460;
  _InputArray local_448;
  _InputArray local_428;
  undefined8 uStack_410;
  vector<BoxPoint,_std::allocator<BoxPoint>_> local_3c8;
  BoxPoint local_3a8;
  int local_388;
  int local_384;
  int local_380;
  int local_37c;
  int local_378;
  int local_374;
  int local_370;
  int local_36c;
  long local_368;
  vector<BoxPoint,_std::allocator<BoxPoint>_> local_360;
  _InputArray local_348;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  long *local_318 [2];
  long local_308 [2];
  double local_2f8;
  undefined8 uStack_2f0;
  double local_2e8;
  undefined8 uStack_2e0;
  int local_2d0 [2];
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined8 local_2c0;
  _OutputArray local_2b8 [2];
  BoxPoint local_288 [3];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_228;
  BoxPoint local_210 [3];
  BoxPoint local_1b0 [3];
  BoxPoint local_150 [3];
  BoxPoint local_f0 [3];
  BoxPoint local_90 [3];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Requires 1 Argument",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_318,argv[1],(allocator<char> *)local_1b0);
    cv::VideoCapture::VideoCapture((VideoCapture *)local_2b8,(string *)local_318,0);
    cv::Mat::Mat((Mat *)local_1b0);
    cv::Mat::Mat((Mat *)local_288);
    cv::Mat::Mat((Mat *)local_90);
    cv::Mat::Mat((Mat *)local_f0);
    cv::Mat::Mat((Mat *)local_150);
    cv::Mat::Mat((Mat *)local_210);
    local_3a8.x = 0.0;
    local_3a8.yHeight = 0.0;
    local_3a8.yWidth = 0.0;
    local_428.sz.width = 0;
    local_428.sz.height = 0;
    local_428.flags = 0x2010000;
    local_428.obj = local_288;
    cv::VideoCapture::read(local_2b8);
    cv::Mat::clone();
    cv::Mat::operator=((Mat *)local_210,(Mat *)&local_428);
    cv::Mat::~Mat((Mat *)&local_428);
    local_428.sz.width = 0;
    local_428.sz.height = 0;
    local_428.flags = 0x1010000;
    local_488.sz.width = 0;
    local_488.sz.height = 0;
    local_488.flags = 0x2010000;
    local_488.obj = local_1b0;
    local_428.obj = local_288;
    cv::cvtColor((cv *)&local_428,&local_488,(_OutputArray *)0x6,0,(int)in_R8);
    local_428.sz.width = 0;
    local_428.sz.height = 0;
    local_428.flags = 0x1010000;
    local_488.sz.width = 0;
    local_488.sz.height = 0;
    local_488.flags = 0x2010000;
    local_2c0 = 0x1500000015;
    local_488.obj = local_1b0;
    local_428.obj = local_1b0;
    cv::GaussianBlur(0,0,&local_428,&local_488);
    local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (BoxPoint *)0x0;
    local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (BoxPoint *)0x0;
    while( true ) {
      iVar6 = (int)in_R8;
      local_428.sz.width = 0;
      local_428.sz.height = 0;
      local_428.flags = 0x2010000;
      local_428.obj = local_288;
      cVar5 = cv::VideoCapture::read(local_2b8);
      if (cVar5 == '\0') break;
      cv::Mat::clone();
      cv::Mat::operator=((Mat *)local_210,(Mat *)&local_428);
      cv::Mat::~Mat((Mat *)&local_428);
      local_428.sz.width = 0;
      local_428.sz.height = 0;
      local_428.flags = 0x1010000;
      local_428.obj = local_288;
      local_488.sz.width = 0;
      local_488.sz.height = 0;
      local_488.flags = 0x2010000;
      local_488.obj = local_90;
      cv::cvtColor((cv *)&local_428,&local_488,(_OutputArray *)0x6,0,iVar6);
      local_428.sz.width = 0;
      local_428.sz.height = 0;
      local_428.flags = 0x1010000;
      local_488.sz.width = 0;
      local_488.sz.height = 0;
      local_488.flags = 0x2010000;
      local_320 = 0x1500000015;
      local_488.obj = local_90;
      local_428.obj = local_90;
      cv::GaussianBlur(0,0,&local_428,&local_488,&local_320,4);
      local_428.sz.width = 0;
      local_428.sz.height = 0;
      local_428.flags = 0x1010000;
      local_428.obj = local_1b0;
      local_488.sz.width = 0;
      local_488.sz.height = 0;
      local_488.flags = 0x1010000;
      local_460.sz.width = 0;
      local_460.sz.height = 0;
      local_460.flags = 0x2010000;
      local_488.obj = local_90;
      local_460.obj = local_f0;
      cv::absdiff(&local_428,&local_488,(_OutputArray *)&local_460);
      local_428.sz.width = 0;
      local_428.sz.height = 0;
      local_428.flags = 0x1010000;
      local_488.sz.width = 0;
      local_488.sz.height = 0;
      local_488.flags = 0x2010000;
      local_488.obj = local_150;
      local_428.obj = local_f0;
      cv::threshold(&local_428,(_OutputArray *)&local_488,25.0,255.0,0);
      local_460.sz.width = 0;
      local_460.sz.height = 0;
      local_460.flags = 0x1010000;
      local_448.sz.width = 0;
      local_448.sz.height = 0;
      local_448.flags = 0x2010000;
      local_460.obj = local_150;
      local_448.obj = local_150;
      cv::Mat::Mat((Mat *)&local_428);
      local_348.sz.width = 0;
      local_348.sz.height = 0;
      local_348.flags = 0x1010000;
      local_328 = 0xffffffffffffffff;
      local_488._0_8_ = (pointer)0x7fefffffffffffff;
      local_488.obj = (pointer)0x7fefffffffffffff;
      local_488.sz.width = -1;
      local_488.sz.height = 0x7fefffff;
      uStack_470 = 0x7fefffffffffffff;
      in_stack_fffffffffffffb68 = &local_488;
      local_348.obj = &local_428;
      cv::dilate(&local_460,&local_448,&local_348,&local_328,2,0,&local_488);
      cv::Mat::~Mat((Mat *)&local_428);
      local_428.sz.width = 0;
      local_428.sz.height = 0;
      local_428.flags = 0x1010000;
      local_488.sz.width = 0;
      local_488.sz.height = 0;
      local_488.flags = 0x8204000c;
      local_488.obj = &local_3a8;
      local_330 = 0;
      in_R8 = &local_330;
      local_428.obj = local_150;
      cv::findContours(&local_428,&local_488,0);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&local_488,
                 ((long)local_3a8.yHeight - (long)local_3a8.x >> 3) * -0x5555555555555555,
                 (allocator_type *)&local_428);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::vector(&local_228,
               (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                *)&local_3a8);
      getCenters((vector<BoxPoint,_std::allocator<BoxPoint>_> *)&local_460,&local_228);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector(&local_228);
      __args = (BoxPoint *)CONCAT44(local_460._4_4_,local_460.flags);
      if ((BoxPoint *)local_460.obj != __args) {
        if (local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<BoxPoint,std::allocator<BoxPoint>>::_M_realloc_insert<BoxPoint&>
                    ((vector<BoxPoint,std::allocator<BoxPoint>> *)&local_3c8,
                     (iterator)
                     local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                     super__Vector_impl_data._M_finish,__args);
        }
        else {
          dVar14 = __args->x;
          dVar1 = __args->yHeight;
          dVar2 = __args->z;
          (local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
           super__Vector_impl_data._M_finish)->yWidth = __args->yWidth;
          (local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
           super__Vector_impl_data._M_finish)->z = dVar2;
          (local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
           super__Vector_impl_data._M_finish)->x = dVar14;
          (local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
           super__Vector_impl_data._M_finish)->yHeight = dVar1;
          local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if (local_3a8.yHeight != local_3a8.x) {
        lVar13 = 0;
        lVar9 = 0;
        uVar12 = 0;
        do {
          local_428.obj = (void *)((long)local_3a8.x + lVar9);
          local_428.sz.width = 0;
          local_428.sz.height = 0;
          local_428.flags = 0x8103000c;
          dVar14 = (double)cv::contourArea(&local_428,false);
          if (300.0 <= dVar14) {
            uVar8 = ((long)local_3a8.yHeight - (long)local_3a8.x >> 3) * -0x5555555555555555;
            if (uVar8 < uVar12 || uVar8 - uVar12 == 0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar12);
            }
            else {
              local_428.obj = (void *)((long)local_3a8.x + lVar9);
              local_428.sz.width = 0;
              local_428.sz.height = 0;
              local_428.flags = -0x7efcfff4;
              cv::boundingRect(&local_348);
              local_448.sz.width = 0;
              local_448.sz.height = 0;
              local_448.flags = 0x3010000;
              local_2d0[0] = local_348.flags;
              local_2d0[1] = local_348._4_4_;
              uStack_2c8 = local_348.obj._0_4_;
              uStack_2c4 = local_348.obj._4_4_;
              local_428._0_8_ = (Size *)0x0;
              local_428.obj = (BoxPoint *)0x0;
              local_428.sz.width = 0;
              local_428.sz.height = 0x406fe000;
              uStack_410 = 0;
              local_448.obj = local_288;
              cv::rectangle(&local_448,local_2d0,&local_428,1,8,0);
              local_448.sz.width = 0;
              local_448.sz.height = 0;
              local_448.flags = 0x3010000;
              lVar3 = CONCAT44(local_460._4_4_,local_460.flags);
              local_448.obj = local_288;
              if (uVar12 < (ulong)((long)local_460.obj - lVar3 >> 5)) {
                local_380 = (int)*(double *)(lVar3 + lVar13);
                local_37c = (int)*(double *)(lVar3 + 0x18 + lVar13);
                local_428._0_8_ = (Size *)0x0;
                local_428.obj = (BoxPoint *)0x0;
                local_428.sz.width = 0;
                local_428.sz.height = 0x406fe000;
                uStack_410 = 0;
                in_stack_fffffffffffffb68 =
                     (_InputArray *)((ulong)in_stack_fffffffffffffb68 & 0xffffffff00000000);
                in_R8 = (undefined8 *)0x1;
                cv::circle(&local_448,&local_380,2,&local_428,1,8,in_stack_fffffffffffffb68);
                goto LAB_00104ca4;
              }
            }
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar12);
            goto LAB_0010522e;
          }
LAB_00104ca4:
          uVar12 = uVar12 + 1;
          lVar9 = lVar9 + 0x18;
          lVar13 = lVar13 + 0x20;
        } while (uVar12 < (ulong)(((long)local_3a8.yHeight - (long)local_3a8.x >> 3) *
                                 -0x5555555555555555));
      }
      local_428._0_8_ = &local_428.sz;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Camera","");
      local_448.sz.width = 0;
      local_448.sz.height = 0;
      local_448.flags = 0x1010000;
      local_448.obj = local_288;
      cv::imshow((string *)&local_428,&local_448);
      if ((Size *)local_428._0_8_ != &local_428.sz) {
        operator_delete((void *)local_428._0_8_,(long)local_428.sz + 1);
      }
      cv::waitKey(0);
      iVar6 = cv::waitKey(1);
      pvVar4 = (void *)CONCAT44(local_460._4_4_,local_460.flags);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,(long)local_460.sz - (long)pvVar4);
      }
      if ((pointer)local_488._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_488._0_8_,(long)local_488.sz - local_488._0_8_);
      }
      if (iVar6 == 0x1b) break;
    }
    std::vector<BoxPoint,_std::allocator<BoxPoint>_>::vector(&local_360,&local_3c8);
    getPredictedTrajectory
              ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)&local_488,&local_360,25.0,0.5);
    if (local_360.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_360.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_360.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_360.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar12 = (long)local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5;
    uVar8 = (long)local_488.obj - local_488._0_8_ >> 5;
    if (uVar8 + uVar12 != 0) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        if (uVar10 < uVar12) {
          pBVar11 = local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar10;
        }
        else {
          if (uVar8 <= uVar10 - uVar12) {
LAB_0010522e:
            uVar7 = std::__throw_out_of_range_fmt
                              (
                              "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              );
            if ((void *)local_448._0_8_ != (void *)0x0) {
              operator_delete((void *)local_448._0_8_,(long)local_448.sz - local_448._0_8_);
            }
            if ((Size *)local_428._0_8_ != &local_428.sz) {
              operator_delete((void *)local_428._0_8_,(long)local_428.sz + 1);
            }
            if ((pointer)local_488._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_488._0_8_,(long)local_488.sz - local_488._0_8_);
            }
            if (local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_3c8.
                                    super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_3c8.
                                    super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            std::
            vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       *)&local_3a8);
            cv::Mat::~Mat((Mat *)local_210);
            cv::Mat::~Mat((Mat *)local_150);
            cv::Mat::~Mat((Mat *)local_f0);
            cv::Mat::~Mat((Mat *)local_90);
            cv::Mat::~Mat((Mat *)local_288);
            cv::Mat::~Mat((Mat *)local_1b0);
            cv::VideoCapture::~VideoCapture((VideoCapture *)local_2b8);
            if (local_318[0] != local_308) {
              operator_delete(local_318[0],local_308[0] + 1);
            }
            _Unwind_Resume(uVar7);
          }
          pBVar11 = (pointer)(local_488._0_8_ + -uVar12 * 0x20 + lVar9);
        }
        dVar14 = pBVar11->x;
        local_2e8 = pBVar11->yHeight;
        local_2f8 = pBVar11->yWidth;
        dVar1 = pBVar11->z;
        local_428._0_8_ = (Size *)0x0;
        uStack_2e0 = 0;
        uStack_2f0 = 0;
        if (uVar10 < uVar12) {
          local_428.sz.width = 0;
          local_428.sz.height = 0x406fe000;
        }
        else {
          local_428._0_8_ = (Size *)0x406fe00000000000;
          local_428.sz.width = 0;
          local_428.sz.height = 0;
        }
        uStack_410 = 0;
        local_428.obj = (BoxPoint *)0x0;
        local_460.sz.width = 0;
        local_460.sz.height = 0;
        local_460.flags = 0x3010000;
        in_stack_fffffffffffffb68 =
             (_InputArray *)((ulong)in_stack_fffffffffffffb68 & 0xffffffff00000000);
        local_460.obj = local_210;
        local_388 = (int)dVar14;
        local_384 = -(int)dVar1;
        local_368 = lVar9;
        cv::circle(&local_460,&local_388,2,&local_428,1,8,in_stack_fffffffffffffb68);
        local_36c = (int)local_2f8;
        local_370 = (int)local_2e8;
        local_374 = -(int)dVar1 - (int)((double)(int)local_2f8 * 0.5);
        local_378 = (int)dVar14 - (int)((double)(int)local_2e8 * 0.5);
        local_460.sz.width = 0;
        local_460.sz.height = 0;
        local_460.flags = 0x3010000;
        local_460.obj = local_210;
        cv::rectangle(&local_460,&local_378,&local_428,1,8,0);
        uVar10 = uVar10 + 1;
        uVar12 = (long)local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                       super__Vector_impl_data._M_start >> 5;
        uVar8 = (long)local_488.obj - local_488._0_8_ >> 5;
        lVar9 = local_368 + 0x20;
      } while (uVar10 < uVar8 + uVar12);
    }
    local_428._0_8_ = &local_428.sz;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Predicted","");
    local_460.sz.width = 0;
    local_460.sz.height = 0;
    local_460.flags = 0x1010000;
    local_460.obj = local_210;
    cv::imshow((string *)&local_428,&local_460);
    if ((Size *)local_428._0_8_ != &local_428.sz) {
      operator_delete((void *)local_428._0_8_,(long)local_428.sz + 1);
    }
    cv::waitKey(0);
    local_428._0_8_ = &local_428.sz;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"output.jpg","");
    local_460.sz.width = 0;
    local_460.sz.height = 0;
    local_460.flags = 0x1010000;
    local_448.sz.width = 0;
    local_448.sz.height = 0;
    local_448._0_8_ = (void *)0x0;
    local_448.obj = (void *)0x0;
    local_460.obj = local_210;
    cv::imwrite((string *)&local_428,&local_460,(vector *)&local_448);
    if ((void *)local_448._0_8_ != (void *)0x0) {
      operator_delete((void *)local_448._0_8_,(long)local_448.sz - local_448._0_8_);
    }
    if ((Size *)local_428._0_8_ != &local_428.sz) {
      operator_delete((void *)local_428._0_8_,(long)local_428.sz + 1);
    }
    if ((pointer)local_488._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_488._0_8_,(long)local_488.sz - local_488._0_8_);
    }
    if (local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3c8.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               *)&local_3a8);
    cv::Mat::~Mat((Mat *)local_210);
    cv::Mat::~Mat((Mat *)local_150);
    cv::Mat::~Mat((Mat *)local_f0);
    cv::Mat::~Mat((Mat *)local_90);
    cv::Mat::~Mat((Mat *)local_288);
    cv::Mat::~Mat((Mat *)local_1b0);
    cv::VideoCapture::~VideoCapture((VideoCapture *)local_2b8);
    if (local_318[0] != local_308) {
      operator_delete(local_318[0],local_308[0] + 1);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char** argv){
    
    if(argc <= 1){
        std::cerr << "Requires 1 Argument" << std::endl;
    }else{
        std::string videoFile = argv[1];
    
        int minContourArea = 300;
        cv::VideoCapture vid = cv::VideoCapture(videoFile);
        cv::Mat firstFrame, frame, grayFrame, frameDelta, thresh, lastFrame;
        std::vector<std::vector<cv::Point>> contours;
        vid.read(frame);
        lastFrame = frame.clone();
        cv::cvtColor(frame, firstFrame, cv::COLOR_BGR2GRAY);
        cv::GaussianBlur(firstFrame, firstFrame, cv::Size(21, 21), 0);


        std::vector<BoxPoint> initialTrajectory;
        
        while(vid.read(frame)){
            lastFrame = frame.clone();
            cv::cvtColor(frame, grayFrame, cv::COLOR_BGR2GRAY); 
            cv::GaussianBlur(grayFrame, grayFrame, cv::Size(21, 21), 0);
            cv::absdiff(firstFrame, grayFrame, frameDelta);
            cv::threshold(frameDelta, thresh, 25, 255, cv::THRESH_BINARY);
            cv::dilate(thresh, thresh, cv::Mat(), cv::Point(-1, -1), 2);
            cv::findContours(thresh, contours, cv::RETR_EXTERNAL, cv::CHAIN_APPROX_SIMPLE);
            
            std::vector<cv::Rect> boundingRect{contours.size()};
            std::vector<BoxPoint> centers = getCenters(contours);
            if(centers.size() > 0){
                initialTrajectory.emplace_back(centers.at(0));
            };
            
            for(size_t i=0; i<contours.size(); i++){
                if(cv::contourArea(contours.at(i)) < minContourArea){ continue; }
          
                cv::Rect rect = cv::boundingRect(contours.at(i));
                cv::rectangle(frame, rect, cv::Scalar(0, 0, 255), 1);

                cv::circle(frame, cv::Point{(int) centers.at(i).x, (int) centers.at(i).z}, 2, cv::Scalar(0, 0, 255));
            }
            
            cv::imshow("Camera", frame);
            cv::waitKey(0);
            if(cv::waitKey(1) == 27){
                break;
            }

        }

        std::vector<BoxPoint> predictedTrajectory = getPredictedTrajectory(initialTrajectory, 25.0, 0.50);
        for(size_t i=0; i<initialTrajectory.size()+predictedTrajectory.size(); i++){
            BoxPoint point = i < initialTrajectory.size() ? initialTrajectory.at(i) : predictedTrajectory.at(i-initialTrajectory.size());
            cv::Scalar color = i < initialTrajectory.size() ? cv::Scalar(0, 0, 255) : cv::Scalar(255, 0, 0);
                    
            cv::Point centerPoint{(int) point.x, -1 * (int) point.z};
            cv::Size boxSize = cv::Size{(int) point.yHeight, (int) point.yWidth};
            cv::Point boxStart{
                centerPoint.x - (int)(0.5*boxSize.width),
                centerPoint.y - (int)(0.5*boxSize.height)};
            cv::Rect box{boxStart, boxSize}; 

            cv::circle(lastFrame, centerPoint, 2, color);
            cv::rectangle(lastFrame, box, color);
        };
        cv::imshow("Predicted", lastFrame);
        cv::waitKey(0); 
        cv::imwrite("output.jpg", lastFrame);
    }
}